

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_impl_avx2.c
# Opt level: O0

uint sad_w64_avg_avx2(uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride,int h,
                     uint8_t *second_pred,int second_pred_stride)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  int in_ECX;
  undefined1 (*in_RDX) [32];
  int in_ESI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  undefined1 (*in_R9) [32];
  undefined1 auVar3 [32];
  int in_stack_00000008;
  __m256i sum_sad_h;
  __m256i sum_sad;
  __m256i ref2_reg;
  __m256i ref1_reg;
  __m256i sad2_reg;
  __m256i sad1_reg;
  int i;
  undefined1 local_3d0 [16];
  undefined1 local_3a0 [32];
  int local_2ec;
  undefined1 (*local_2e8) [32];
  undefined1 (*local_2d8) [32];
  undefined1 (*local_2c8) [32];
  uint local_e0;
  
  local_3a0 = ZEXT1632(ZEXT816(0));
  local_2e8 = in_R9;
  local_2d8 = in_RDX;
  local_2c8 = in_RDI;
  for (local_2ec = 0; local_2ec < in_R8D; local_2ec = local_2ec + 1) {
    auVar3 = vpavgb_avx2(*local_2d8,*local_2e8);
    auVar2 = vpavgb_avx2(local_2d8[1],local_2e8[1]);
    auVar3 = vpsadbw_avx2(auVar3,*local_2c8);
    auVar2 = vpsadbw_avx2(auVar2,local_2c8[1]);
    auVar3 = vpaddd_avx2(auVar3,auVar2);
    local_3a0 = vpaddd_avx2(local_3a0,auVar3);
    local_2d8 = (undefined1 (*) [32])(*local_2d8 + in_ECX);
    local_2c8 = (undefined1 (*) [32])(*local_2c8 + in_ESI);
    local_2e8 = (undefined1 (*) [32])(*local_2e8 + in_stack_00000008);
  }
  auVar3 = vpsrldq_avx2(local_3a0,8);
  auVar3 = vpaddd_avx2(local_3a0,auVar3);
  auVar1 = vpaddd_avx(auVar3._0_16_,local_3d0);
  local_e0 = auVar1._0_4_;
  return local_e0;
}

Assistant:

static unsigned int sad_w64_avg_avx2(const uint8_t *src_ptr, int src_stride,
                                     const uint8_t *ref_ptr, int ref_stride,
                                     const int h, const uint8_t *second_pred,
                                     const int second_pred_stride) {
  int i;
  __m256i sad1_reg, sad2_reg, ref1_reg, ref2_reg;
  __m256i sum_sad = _mm256_setzero_si256();
  __m256i sum_sad_h;
  __m128i sum_sad128;
  for (i = 0; i < h; i++) {
    ref1_reg = _mm256_loadu_si256((__m256i const *)ref_ptr);
    ref2_reg = _mm256_loadu_si256((__m256i const *)(ref_ptr + 32));
    ref1_reg = _mm256_avg_epu8(
        ref1_reg, _mm256_loadu_si256((__m256i const *)second_pred));
    ref2_reg = _mm256_avg_epu8(
        ref2_reg, _mm256_loadu_si256((__m256i const *)(second_pred + 32)));
    sad1_reg =
        _mm256_sad_epu8(ref1_reg, _mm256_loadu_si256((__m256i const *)src_ptr));
    sad2_reg = _mm256_sad_epu8(
        ref2_reg, _mm256_loadu_si256((__m256i const *)(src_ptr + 32)));
    sum_sad = _mm256_add_epi32(sum_sad, _mm256_add_epi32(sad1_reg, sad2_reg));
    ref_ptr += ref_stride;
    src_ptr += src_stride;
    second_pred += second_pred_stride;
  }
  sum_sad_h = _mm256_srli_si256(sum_sad, 8);
  sum_sad = _mm256_add_epi32(sum_sad, sum_sad_h);
  sum_sad128 = _mm256_extracti128_si256(sum_sad, 1);
  sum_sad128 = _mm_add_epi32(_mm256_castsi256_si128(sum_sad), sum_sad128);
  return (unsigned int)_mm_cvtsi128_si32(sum_sad128);
}